

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall r_exec::View::View(View *this,View *view,Group *group)

{
  double dVar1;
  pointer pcVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  byte bVar6;
  uint64_t uVar7;
  Atom *pAVar8;
  Code *pCVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Atom local_44 [4];
  Atom local_40 [4];
  Atom local_3c [4];
  Group *local_38;
  Group *source;
  Group *local_20;
  Group *group_local;
  View *view_local;
  View *this_local;
  
  local_20 = group;
  group_local = (Group *)view;
  view_local = this;
  r_code::View::View(&this->super_View);
  (this->super_View).super__Object._vptr__Object = (_func_int **)&PTR__View_002ed5f8;
  core::P<r_exec::Controller>::P(&this->controller,(Controller *)0x0);
  std::mutex::mutex(&this->m_groupMutex);
  local_38 = get_host((View *)group_local);
  core::P<r_code::Code>::operator=
            (&(this->super_View).object,
             (P<r_code::Code> *)
             &(group_local->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
              super_LObject.super_Code.markers.cells.
              super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  *(undefined4 *)&(this->super_View).field_0x58 =
       *(undefined4 *)
        &(group_local->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
         super_Code.views._M_h._M_buckets;
  pcVar2 = (group_local->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
           .super_Code.markers.cells.
           super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  iVar3 = (group_local->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.markers.used_cells_head;
  iVar4 = (group_local->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.markers.used_cells_tail;
  iVar5 = (group_local->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.markers.free_cells;
  uVar7 = (group_local->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.markers.free_cell_count;
  *(uint64_t *)&(this->super_View).field_0x48 =
       (group_local->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
       super_Code.markers.used_cell_count;
  *(uint64_t *)&(this->super_View).field_0x50 = uVar7;
  *(int64_t *)&(this->super_View).field_0x38 = iVar4;
  *(int64_t *)&(this->super_View).field_0x40 = iVar5;
  *(pointer *)&(this->super_View).field_0x28 = pcVar2;
  *(int64_t *)&(this->super_View).field_0x30 = iVar3;
  uVar7 = GetOID();
  *(int *)&(this->super_View).field_0x58 = (int)uVar7;
  (this->super_View).references[0] = (Code *)local_20;
  (this->super_View).references[1] = (Code *)local_38;
  r_code::View::code((View *)group_local,3);
  fVar10 = (float)r_code::Atom::asFloat();
  fVar11 = Group::get_sln_thr(local_38);
  fVar12 = Group::get_sln_thr(local_20);
  dVar1 = MorphValue((double)fVar10,(double)fVar11,(double)fVar12);
  r_code::Atom::Float((float)dVar1);
  pAVar8 = r_code::View::code(&this->super_View,3);
  r_code::Atom::operator=(pAVar8,local_3c);
  r_code::Atom::~Atom(local_3c);
  pCVar9 = core::P<r_code::Code>::operator->(&(this->super_View).object);
  (*(pCVar9->super__Object)._vptr__Object[4])(pCVar9,0);
  bVar6 = r_code::Atom::getDescriptor();
  if (bVar6 == 200) {
    r_code::View::code((View *)group_local,8);
    fVar10 = (float)r_code::Atom::asFloat();
    fVar11 = Group::get_vis_thr(local_38);
    fVar12 = Group::get_vis_thr(local_20);
    dVar1 = MorphValue((double)fVar10,(double)fVar11,(double)fVar12);
    r_code::Atom::Float((float)dVar1);
    pAVar8 = r_code::View::code(&this->super_View,8);
    r_code::Atom::operator=(pAVar8,local_40);
    r_code::Atom::~Atom(local_40);
  }
  else if (bVar6 - 0xc9 < 7) {
    r_code::View::code((View *)group_local,7);
    fVar10 = (float)r_code::Atom::asFloat();
    fVar11 = Group::get_act_thr(local_38);
    fVar12 = Group::get_act_thr(local_20);
    dVar1 = MorphValue((double)fVar10,(double)fVar11,(double)fVar12);
    r_code::Atom::Float((float)dVar1);
    pAVar8 = r_code::View::code(&this->super_View,7);
    r_code::Atom::operator=(pAVar8,local_44);
    r_code::Atom::~Atom(local_44);
  }
  reset(this);
  return;
}

Assistant:

View::View(View *view, Group *group): r_code::View(), controller(nullptr)
{
    Group *source = view->get_host();
    object = view->object;
    memcpy(_code, view->_code, VIEW_CODE_MAX_SIZE * sizeof(Atom));
    _code[VIEW_OID].atom = GetOID();
    references[0] = group; // host.
    references[1] = source; // origin.
    // morph ctrl values; NB: res is not morphed as it is expressed as a multiple of the upr.
    code(VIEW_SLN) = Atom::Float(MorphValue(view->code(VIEW_SLN).asFloat(), source->get_sln_thr(), group->get_sln_thr()));

    switch (object->code(0).getDescriptor()) {
    case Atom::GROUP:
        code(GRP_VIEW_VIS) = Atom::Float(MorphValue(view->code(GRP_VIEW_VIS).asFloat(), source->get_vis_thr(), group->get_vis_thr()));
        break;

    case Atom::NULL_PROGRAM:
    case Atom::INSTANTIATED_PROGRAM:
    case Atom::INSTANTIATED_CPP_PROGRAM:
    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
    case Atom::INSTANTIATED_ANTI_PROGRAM:
    case Atom::COMPOSITE_STATE:
    case Atom::MODEL:
        code(VIEW_ACT) = Atom::Float(MorphValue(view->code(VIEW_ACT).asFloat(), source->get_act_thr(), group->get_act_thr()));
        break;
    }

    reset();
}